

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool usage_requirements_only)

{
  cmLocalGenerator *pcVar1;
  undefined8 __s;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  TargetType TVar5;
  ulong uVar6;
  char *pcVar7;
  ostream *poVar8;
  string *psVar9;
  const_iterator __first;
  const_iterator __last;
  PolicyID id;
  PolicyID id_00;
  string local_548;
  string local_528;
  undefined1 local_508 [8];
  ostringstream w_1;
  undefined1 local_390 [8];
  string newLibraries;
  string oldLibraries;
  string local_348;
  bool local_321;
  char *pcStack_320;
  bool hadHeadSensitiveConditionDummy;
  char *newExplicitLibraries_1;
  undefined1 local_310 [8];
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_2e0;
  const_iterator local_2d8;
  cmLinkImplementationLibraries *local_2d0;
  cmLinkImplementationLibraries *impl;
  string local_2c0;
  undefined4 local_29c;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  ostringstream w;
  allocator<char> local_d9;
  string local_d8;
  char *local_b8;
  char *newExplicitLibraries;
  string linkIfaceProp;
  char *explicitLibraries;
  allocator<char> local_51;
  string local_50 [8];
  string suffix;
  bool usage_requirements_only_local;
  cmGeneratorTarget *headTarget_local;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  suffix.field_2._M_local_buf[0xf] = usage_requirements_only;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"_",&local_51);
  std::allocator<char>::~allocator(&local_51);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)&explicitLibraries,config);
    std::__cxx11::string::operator+=(local_50,(string *)&explicitLibraries);
    std::__cxx11::string::~string((string *)&explicitLibraries);
  }
  else {
    std::__cxx11::string::operator+=(local_50,"NOCONFIG");
  }
  linkIfaceProp.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&newExplicitLibraries);
  PVar3 = GetPolicyStatusCMP0022(this);
  if ((PVar3 == OLD) || (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == WARN)) {
    TVar5 = GetType(this);
    if ((TVar5 == SHARED_LIBRARY) || (bVar2 = IsExecutableWithExports(this), bVar2)) {
      std::__cxx11::string::operator=((string *)&newExplicitLibraries,"LINK_INTERFACE_LIBRARIES");
      std::__cxx11::string::operator+=((string *)&newExplicitLibraries,local_50);
      linkIfaceProp.field_2._8_8_ = GetProperty(this,(string *)&newExplicitLibraries);
      if ((char *)linkIfaceProp.field_2._8_8_ == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&newExplicitLibraries,"LINK_INTERFACE_LIBRARIES");
        linkIfaceProp.field_2._8_8_ = GetProperty(this,(string *)&newExplicitLibraries);
      }
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&newExplicitLibraries,"INTERFACE_LINK_LIBRARIES");
    linkIfaceProp.field_2._8_8_ = GetProperty(this,(string *)&newExplicitLibraries);
  }
  if (((linkIfaceProp.field_2._8_8_ != 0) && (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == WARN))
     && ((this->PolicyWarnedCMP0022 & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"INTERFACE_LINK_LIBRARIES",&local_d9);
    pcVar7 = GetProperty(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_b8 = pcVar7;
    if ((pcVar7 != (char *)0x0) &&
       (iVar4 = strcmp(pcVar7,(char *)linkIfaceProp.field_2._8_8_), iVar4 != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_278,(cmPolicies *)0x16,id);
      poVar8 = std::operator<<((ostream *)local_258,(string *)&local_278);
      poVar8 = std::operator<<(poVar8,"\nTarget \"");
      psVar9 = GetName_abi_cxx11_(this);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,
                               "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                              );
      poVar8 = std::operator<<(poVar8,(string *)&newExplicitLibraries);
      poVar8 = std::operator<<(poVar8," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
      poVar8 = std::operator<<(poVar8,local_b8);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,(string *)&newExplicitLibraries);
      poVar8 = std::operator<<(poVar8,":\n  ");
      poVar8 = std::operator<<(poVar8,(char *)linkIfaceProp.field_2._8_8_);
      std::operator<<(poVar8,"\n");
      std::__cxx11::string::~string((string *)&local_278);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      this->PolicyWarnedCMP0022 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    }
  }
  if ((linkIfaceProp.field_2._8_8_ == 0) &&
     ((TVar5 = GetType(this), TVar5 == EXECUTABLE ||
      (TVar5 = GetType(this), TVar5 == MODULE_LIBRARY)))) {
    local_29c = 1;
  }
  else {
    __s = linkIfaceProp.field_2._8_8_;
    (iface->super_cmLinkInterface).field_0x6b = 1;
    iface->ExplicitLibraries = (char *)linkIfaceProp.field_2._8_8_;
    if (linkIfaceProp.field_2._8_8_ == 0) {
      PVar3 = GetPolicyStatusCMP0022(this);
      if ((PVar3 == WARN) || (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == OLD)) {
        local_2d0 = GetLinkImplementationLibrariesInternal(this,config,headTarget);
        local_2e0._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        __gnu_cxx::
        __normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>::
        __normal_iterator<cmLinkItem*>
                  ((__normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                    *)&local_2d8,&local_2e0);
        __first = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                            (&local_2d0->Libraries);
        __last = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           (&local_2d0->Libraries);
        ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
                      insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                                ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,local_2d8,
                                 (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                  )__first._M_current,
                                 (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                  )__last._M_current);
        PVar3 = GetPolicyStatusCMP0022(this);
        if ((PVar3 == WARN) &&
           (((this->PolicyWarnedCMP0022 & 1U) == 0 && ((suffix.field_2._M_local_buf[0xf] & 1U) == 0)
            ))) {
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::vector
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_310);
          if ((ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
               ::newProp_abi_cxx11_ == '\0') &&
             (iVar4 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                           ::newProp_abi_cxx11_), iVar4 != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)
                       &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                        ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",
                       (allocator<char> *)((long)&newExplicitLibraries_1 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&newExplicitLibraries_1 + 7))
            ;
            __cxa_atexit(std::__cxx11::string::~string,
                         &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                          ::newProp_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                 ::newProp_abi_cxx11_);
          }
          pcVar7 = GetProperty(this,&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                     ::newProp_abi_cxx11_);
          pcStack_320 = pcVar7;
          if (pcVar7 != (char *)0x0) {
            local_321 = false;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_348,pcVar7,
                       (allocator<char> *)(oldLibraries.field_2._M_local_buf + 0xf));
            ExpandLinkItems(this,&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                  ::newProp_abi_cxx11_,&local_348,config,headTarget,
                            (bool)(suffix.field_2._M_local_buf[0xf] & 1),
                            (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_310,&local_321)
            ;
            std::__cxx11::string::~string((string *)&local_348);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(oldLibraries.field_2._M_local_buf + 0xf));
          }
          bVar2 = std::operator!=((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_310,
                                  (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
          if (bVar2) {
            cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                      ((string *)((long)&newLibraries.field_2 + 8),&local_2d0->Libraries,";");
            cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                      ((string *)local_390,
                       (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_310,";");
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) != 0) {
              std::__cxx11::string::operator=
                        ((string *)(newLibraries.field_2._M_local_buf + 8),"(empty)");
            }
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) != 0) {
              std::__cxx11::string::operator=((string *)local_390,"(empty)");
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_528,(cmPolicies *)0x16,id_00);
            poVar8 = std::operator<<((ostream *)local_508,(string *)&local_528);
            poVar8 = std::operator<<(poVar8,"\nTarget \"");
            psVar9 = GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            poVar8 = std::operator<<(poVar8,
                                     "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                    );
            poVar8 = std::operator<<(poVar8,(string *)local_390);
            poVar8 = std::operator<<(poVar8,"\nLink implementation:\n  ");
            poVar8 = std::operator<<(poVar8,(string *)(newLibraries.field_2._M_local_buf + 8));
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_528);
            pcVar1 = this->LocalGenerator;
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_548);
            std::__cxx11::string::~string((string *)&local_548);
            this->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
            std::__cxx11::string::~string((string *)local_390);
            std::__cxx11::string::~string((string *)(newLibraries.field_2._M_local_buf + 8));
          }
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_310);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,(char *)__s,(allocator<char> *)((long)&impl + 7));
      ExpandLinkItems(this,(string *)&newExplicitLibraries,&local_2c0,config,headTarget,
                      (bool)(suffix.field_2._M_local_buf[0xf] & 1),
                      (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
                      (bool *)&(iface->super_cmLinkInterface).field_0x6c);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
    }
    local_29c = 0;
  }
  std::__cxx11::string::~string((string *)&newExplicitLibraries);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, bool usage_requirements_only) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = nullptr;
  std::string linkIfaceProp;
  if (this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
      this->GetPolicyStatusCMP0022() != cmPolicies::WARN) {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = this->GetProperty(linkIfaceProp);
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = this->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if (!explicitLibraries) {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = this->GetProperty(linkIfaceProp);
    }
  }

  if (explicitLibraries &&
      this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
      !this->PolicyWarnedCMP0022) {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      this->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries &&
        strcmp(newExplicitLibraries, explicitLibraries) != 0) {
      std::ostringstream w;
      /* clang-format off */
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << this->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << explicitLibraries << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
    }
  }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if (!explicitLibraries &&
      (this->GetType() == cmStateEnums::EXECUTABLE ||
       (this->GetType() == cmStateEnums::MODULE_LIBRARY))) {
    return;
  }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if (explicitLibraries) {
    // The interface libraries have been explicitly set.
    this->ExpandLinkItems(linkIfaceProp, explicitLibraries, config, headTarget,
                          usage_requirements_only, iface.Libraries,
                          iface.HadHeadSensitiveCondition);
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD)
  // If CMP0022 is NEW then the plain tll signature sets the
  // INTERFACE_LINK_LIBRARIES, so if we get here then the project
  // cleared the property explicitly and we should not fall back
  // to the link implementation.
  {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(), impl->Libraries.begin(),
                           impl->Libraries.end());
    if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022 && !usage_requirements_only) {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if (const char* newExplicitLibraries = this->GetProperty(newProp)) {
        bool hadHeadSensitiveConditionDummy = false;
        this->ExpandLinkItems(newProp, newExplicitLibraries, config,
                              headTarget, usage_requirements_only, ifaceLibs,
                              hadHeadSensitiveConditionDummy);
      }
      if (ifaceLibs != iface.Libraries) {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if (oldLibraries.empty()) {
          oldLibraries = "(empty)";
        }
        if (newLibraries.empty()) {
          newLibraries = "(empty)";
        }

        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }
  }
}